

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O0

int libj1939_connect_socket(int sock,sockaddr_can *addr)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  sockaddr *in_RSI;
  int in_EDI;
  int ret;
  uint local_4;
  
  iVar1 = connect(in_EDI,in_RSI,0x18);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    __stream = _stderr;
    local_4 = -*piVar2;
    pcVar3 = strerror(local_4);
    fprintf(__stream,"failed to connect socket: %d (%s)",(ulong)local_4,pcVar3);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int libj1939_connect_socket(int sock, struct sockaddr_can *addr)
{
	int ret;

	ret = connect(sock, (void *)addr, sizeof(*addr));
	if (ret < 0) {
		ret = -errno;
		pr_err("failed to connect socket: %d (%s)", ret, strerror(ret));
		return ret;
	}

	return 0;
}